

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void google::protobuf::internal::MapMergeFrom<unsigned_int,proto2_unittest::TestIntIntMap>
               (Map<unsigned_int,_proto2_unittest::TestIntIntMap> *dest,
               Map<unsigned_int,_proto2_unittest::TestIntIntMap> *src)

{
  bool bVar1;
  reference key;
  TestIntIntMap *this;
  value_type *elem;
  const_iterator __end0;
  const_iterator __begin0;
  Map<unsigned_int,_proto2_unittest::TestIntIntMap> *__range3;
  Map<unsigned_int,_proto2_unittest::TestIntIntMap> *src_local;
  Map<unsigned_int,_proto2_unittest::TestIntIntMap> *dest_local;
  
  Map<unsigned_int,_proto2_unittest::TestIntIntMap>::begin
            ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_,src);
  Map<unsigned_int,_proto2_unittest::TestIntIntMap>::end((const_iterator *)&elem,src);
  while( true ) {
    bVar1 = protobuf::operator!=
                      ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_,
                       (const_iterator *)&elem);
    if (!bVar1) break;
    key = Map<unsigned_int,_proto2_unittest::TestIntIntMap>::const_iterator::operator*
                    ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_);
    this = Map<unsigned_int,_proto2_unittest::TestIntIntMap>::operator[]<unsigned_int>
                     (dest,&key->first);
    proto2_unittest::TestIntIntMap::operator=(this,&key->second);
    Map<unsigned_int,_proto2_unittest::TestIntIntMap>::const_iterator::operator++
              ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_);
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void MapMergeFrom(Map<T...>& dest, const Map<T...>& src) {
  for (const auto& elem : src) {
    dest[elem.first] = elem.second;
  }
}